

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseArithmetic(ParseContext *ctx)

{
  SmallArray<SynBinaryOpElement,_32U> *this;
  uint uVar1;
  LexemeType type;
  Lexeme *begin;
  SynBinaryOpType op;
  uint uVar2;
  uint uVar3;
  int iVar4;
  SynBinaryOp *rhs;
  SynBinaryOpElement *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Lexeme *end;
  undefined4 extraout_var_01;
  SynBinaryOpElement local_50;
  
  rhs = (SynBinaryOp *)ParseTerminal(ctx);
  if (rhs == (SynBinaryOp *)0x0) {
    rhs = (SynBinaryOp *)0x0;
  }
  else {
    this = &ctx->binaryOpStack;
    uVar1 = (ctx->binaryOpStack).count;
    do {
      begin = ctx->currentLexeme;
      type = begin->type;
      op = GetBinaryOpType(type);
      if (op == SYN_BINARY_OP_UNKNOWN) break;
      if (type != lex_none) {
        ctx->currentLexeme = begin + 1;
      }
      while (uVar1 < (ctx->binaryOpStack).count) {
        pSVar5 = SmallArray<SynBinaryOpElement,_32U>::back(this);
        uVar2 = GetBinaryOpPrecedence(pSVar5->type);
        uVar3 = GetBinaryOpPrecedence(op);
        if (uVar3 < uVar2) break;
        pSVar5 = SmallArray<SynBinaryOpElement,_32U>::back(this);
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        SynBinaryOp::SynBinaryOp
                  ((SynBinaryOp *)CONCAT44(extraout_var,iVar4),pSVar5->begin,pSVar5->end,
                   pSVar5->type,pSVar5->value,&rhs->super_SynBase);
        SmallArray<SynBinaryOpElement,_32U>::pop_back(this);
        rhs = (SynBinaryOp *)CONCAT44(extraout_var,iVar4);
      }
      local_50.end = ParseContext::Previous(ctx);
      local_50.begin = begin;
      local_50.type = op;
      local_50.value = &rhs->super_SynBase;
      SmallArray<SynBinaryOpElement,_32U>::push_back(this,&local_50);
      rhs = (SynBinaryOp *)ParseTerminal(ctx);
      if (rhs == (SynBinaryOp *)0x0) {
        anon_unknown.dwarf_1519a::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after binary operation");
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        rhs = (SynBinaryOp *)CONCAT44(extraout_var_00,iVar4);
        end = ParseContext::Previous(ctx);
        SynError::SynError((SynError *)rhs,begin,end);
      }
    } while (op != SYN_BINARY_OP_UNKNOWN);
    while (uVar1 < (ctx->binaryOpStack).count) {
      pSVar5 = SmallArray<SynBinaryOpElement,_32U>::back(this);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      SynBinaryOp::SynBinaryOp
                ((SynBinaryOp *)CONCAT44(extraout_var_01,iVar4),pSVar5->begin,pSVar5->end,
                 pSVar5->type,pSVar5->value,&rhs->super_SynBase);
      SmallArray<SynBinaryOpElement,_32U>::pop_back(this);
      rhs = (SynBinaryOp *)CONCAT44(extraout_var_01,iVar4);
    }
  }
  return &rhs->super_SynBase;
}

Assistant:

SynBase* ParseArithmetic(ParseContext &ctx)
{
	SynBase *lhs = ParseTerminal(ctx);

	if(!lhs)
		return NULL;

	unsigned startSize = ctx.binaryOpStack.size();

	while(SynBinaryOpType binaryOp = GetBinaryOpType(ctx.Peek()))
	{
		Lexeme *start = ctx.currentLexeme;

		ctx.Skip();

		while(ctx.binaryOpStack.size() > startSize && GetBinaryOpPrecedence(ctx.binaryOpStack.back().type) <= GetBinaryOpPrecedence(binaryOp))
		{
			SynBinaryOpElement &lastOp = ctx.binaryOpStack.back();

			lhs = new (ctx.get<SynBinaryOp>()) SynBinaryOp(lastOp.begin, lastOp.end, lastOp.type, lastOp.value, lhs);

			ctx.binaryOpStack.pop_back();
		}

		ctx.binaryOpStack.push_back(SynBinaryOpElement(start, ctx.Previous(), binaryOp, lhs));

		lhs = ParseTerminal(ctx);

		if(!lhs)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after binary operation");

			lhs = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}
	}

	while(ctx.binaryOpStack.size() > startSize)
	{
		SynBinaryOpElement &lastOp = ctx.binaryOpStack.back();

		lhs = new (ctx.get<SynBinaryOp>()) SynBinaryOp(lastOp.begin, lastOp.end, lastOp.type, lastOp.value, lhs);

		ctx.binaryOpStack.pop_back();
	}

	return lhs;
}